

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

int __thiscall
cmExtraCodeBlocksGenerator::GetCBTargetType
          (cmExtraCodeBlocksGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  uint uVar4;
  string local_68;
  string local_48;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == EXECUTABLE) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"WIN32_EXECUTABLE","");
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_48);
    bVar2 = true;
    if (!bVar1) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"MACOSX_BUNDLE","");
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    uVar4 = (uint)(bVar2 ^ 1);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(target);
    uVar4 = 2;
    if ((TVar3 != STATIC_LIBRARY) &&
       (TVar3 = cmGeneratorTarget::GetType(target), TVar3 != OBJECT_LIBRARY)) {
      TVar3 = cmGeneratorTarget::GetType(target);
      uVar4 = 3;
      if (TVar3 != SHARED_LIBRARY) {
        TVar3 = cmGeneratorTarget::GetType(target);
        uVar4 = (TVar3 != MODULE_LIBRARY) + 3;
      }
    }
  }
  return uVar4;
}

Assistant:

int cmExtraCodeBlocksGenerator::GetCBTargetType(cmGeneratorTarget* target)
{
  if ( target->GetType()==cmState::EXECUTABLE)
    {
    if ((target->GetPropertyAsBool("WIN32_EXECUTABLE"))
        || (target->GetPropertyAsBool("MACOSX_BUNDLE")))
      {
      return 0;
      }
    else
      {
      return 1;
      }
    }
  else if (( target->GetType()==cmState::STATIC_LIBRARY)
        || (target->GetType()==cmState::OBJECT_LIBRARY))
    {
    return 2;
    }
  else if ((target->GetType()==cmState::SHARED_LIBRARY)
           || (target->GetType()==cmState::MODULE_LIBRARY))
    {
    return 3;
    }
  return 4;
}